

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifier.c
# Opt level: O3

char * flatcc_verify_error_string(int err)

{
  if ((uint)err < 0x26) {
    return &DAT_0013a434 + *(int *)(&DAT_0013a434 + (ulong)(uint)err * 4);
  }
  return "unknown";
}

Assistant:

const char *flatcc_verify_error_string(int err)
{
    switch (err) {
#define XX(no, str)                                                         \
    case flatcc_verify_error_##no:                                          \
        return str;
        FLATCC_VERIFY_ERROR_MAP(XX)
#undef XX
    default:
        return "unknown";
    }
}